

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O1

suffix_table_type * __thiscall
frozen::boyer_moore_searcher<4UL>::build_suffix_table
          (suffix_table_type *__return_storage_ptr__,boyer_moore_searcher<4UL> *this,
          char (*needle) [5])

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  long lVar5;
  size_t p;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  long local_48 [4];
  suffix_table_type suffix;
  
  local_48[2] = 0;
  local_48[3] = 0;
  local_48[0] = 0;
  local_48[1] = 0;
  cVar4 = (*needle)[0];
  lVar7 = 3;
  lVar10 = 0;
  lVar12 = 3;
  do {
    lVar1 = lVar12 + 1;
    bVar14 = lVar1 == 4;
    if ((!bVar14) && (cVar4 == (*needle)[lVar1])) {
      pcVar11 = *needle;
      lVar5 = -1;
      do {
        lVar13 = lVar5;
        if (lVar10 == lVar13) break;
        pcVar2 = pcVar11 + 1;
        pcVar3 = pcVar11 + lVar10 + 5;
        pcVar11 = pcVar11 + 1;
        lVar5 = lVar13 + -1;
      } while (*pcVar2 == *pcVar3);
      bVar14 = 3U - lVar12 <= (ulong)-lVar13;
    }
    if (bVar14) {
      lVar7 = lVar1;
    }
    local_48[lVar12] = (lVar7 - lVar12) + 3;
    lVar10 = lVar10 + -1;
    bVar14 = lVar12 != 0;
    lVar12 = lVar12 + -1;
  } while (bVar14);
  uVar6 = 0;
  do {
    if (uVar6 == 0) {
      uVar9 = 0;
    }
    else {
      uVar8 = 0;
      pcVar11 = *needle;
      do {
        uVar9 = uVar8;
        if (pcVar11[uVar6] != pcVar11[3]) break;
        uVar8 = uVar8 + 1;
        pcVar11 = pcVar11 + -1;
        uVar9 = uVar6;
      } while (uVar6 != uVar8);
    }
    if (uVar6 <= uVar9) {
      uVar9 = uVar6;
    }
    if (*(char *)((long)needle + (uVar6 - uVar9)) != *(char *)((long)needle + (3 - uVar9))) {
      local_48[3 - uVar9] = (uVar9 - uVar6) + 3;
    }
    uVar6 = uVar6 + 1;
    if (uVar6 == 3) {
      __return_storage_ptr__->data_[2] = local_48[2];
      __return_storage_ptr__->data_[3] = local_48[3];
      __return_storage_ptr__->data_[0] = local_48[0];
      __return_storage_ptr__->data_[1] = local_48[1];
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

constexpr auto build_suffix_table(char const (&needle)[size + 1]) {
    suffix_table_type suffix;
    std::ptrdiff_t last_prefix_index = size - 1;

    // first loop
    for (std::ptrdiff_t p = size - 1; p >= 0; p--) {
      if (is_prefix(needle, p + 1))
        last_prefix_index = p + 1;

      suffix[p] = last_prefix_index + (size - 1 - p);
    }

    // second loop
    for (std::size_t p = 0; p < size - 1; p++) {
      auto slen = suffix_length(needle, p);
      if (needle[p - slen] != needle[size - 1 - slen])
        suffix[size - 1 - slen] = size - 1 - p + slen;

    }
    return suffix;
  }